

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

UINT GetTempFileNameW(LPCWSTR lpPathName,LPCWSTR lpPrefixString,UINT uUnique,LPWSTR lpTempFileName)

{
  long lVar1;
  DWORD DVar2;
  UINT UVar3;
  int iVar4;
  size_t sVar5;
  char *lpMultiByteStr;
  char *lpMultiByteStr_00;
  LPCSTR lpTempFileName_00;
  int *piVar6;
  int iVar7;
  UINT UVar8;
  long in_FS_OFFSET;
  undefined1 local_b8 [8];
  PathCharString prefix_stringPS;
  PathCharString full_namePS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prefix_stringPS._32_8_ = local_b8;
  prefix_stringPS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001253b1;
  CorUnix::InternalGetCurrentThread();
  iVar4 = 0x10b;
  if ((lpPathName == (LPCWSTR)0x0) || (*lpPathName == L'\0')) {
LAB_00125362:
    piVar6 = __errno_location();
    *piVar6 = iVar4;
    UVar8 = 0;
  }
  else {
    sVar5 = PAL_wcslen(lpPathName);
    iVar7 = ((int)sVar5 + 1) * MaxWCharToAcpLengthFactor;
    lpMultiByteStr =
         StackString<32UL,_char>::OpenStringBuffer
                   ((StackString<32UL,_char> *)&prefix_stringPS.m_count,(long)iVar7);
    iVar4 = 8;
    if (lpMultiByteStr == (char *)0x0) goto LAB_00125362;
    iVar7 = WideCharToMultiByte(0,0,lpPathName,-1,lpMultiByteStr,iVar7,(LPCSTR)0x0,(LPBOOL)0x0);
    prefix_stringPS.m_count._0_1_ = 0;
    if (iVar7 == 0) {
      DVar2 = GetLastError();
      if (DVar2 == 0x7a) {
LAB_00125243:
        iVar4 = 0xce;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001253b1;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","GetTempFileNameW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0xe81);
        iVar4 = 0x54f;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
      }
      goto LAB_00125362;
    }
    if (lpPrefixString != (LPCWSTR)0x0) {
      sVar5 = PAL_wcslen(lpPrefixString);
      lpMultiByteStr_00 =
           StackString<32UL,_char>::OpenStringBuffer
                     ((StackString<32UL,_char> *)local_b8,
                      (long)(((int)sVar5 + 1) * MaxWCharToAcpLengthFactor));
      if (lpMultiByteStr_00 != (char *)0x0) {
        iVar7 = WideCharToMultiByte(0,0,lpPrefixString,-1,lpMultiByteStr_00,0x3f8 - iVar7,
                                    (LPCSTR)0x0,(LPBOOL)0x0);
        if ((ulong)(long)iVar7 < prefix_stringPS.m_size) {
          prefix_stringPS.m_size = (long)iVar7;
        }
        *(undefined1 *)(prefix_stringPS._32_8_ + prefix_stringPS.m_size) = 0;
        if (iVar7 != 0) goto LAB_00125260;
        DVar2 = GetLastError();
        if (DVar2 == 0x7a) goto LAB_00125243;
        fprintf(_stderr,"] %s %s:%d","GetTempFileNameW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0xea2);
        iVar4 = 0x54f;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
      }
      goto LAB_00125362;
    }
    lpMultiByteStr_00 = (LPCSTR)0x0;
LAB_00125260:
    lpTempFileName_00 = (LPCSTR)CorUnix::InternalMalloc(0x400);
    if (lpTempFileName_00 == (LPCSTR)0x0) goto LAB_00125362;
    UVar3 = GetTempFileNameA(lpMultiByteStr,lpMultiByteStr_00,0,lpTempFileName_00);
    UVar8 = 0;
    if (UVar3 != 0) {
      iVar4 = MultiByteToWideChar(0,0,lpTempFileName_00,-1,lpTempFileName,0x400);
      CorUnix::InternalFree(lpTempFileName_00);
      UVar8 = UVar3;
      if (iVar4 == 0) {
        DVar2 = GetLastError();
        if (DVar2 == 0x7a) goto LAB_00125243;
        fprintf(_stderr,"] %s %s:%d","GetTempFileNameW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0xec6);
        iVar4 = 0x54f;
        fprintf(_stderr,"MultiByteToWideChar failure! error is %d",(ulong)DVar2);
        goto LAB_00125362;
      }
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_b8);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&prefix_stringPS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return UVar8;
    }
    __stack_chk_fail();
  }
LAB_001253b1:
  abort();
}

Assistant:

UINT
PALAPI
GetTempFileNameW(
         IN LPCWSTR lpPathName,
         IN LPCWSTR lpPrefixString,
         IN UINT uUnique,
         OUT LPWSTR lpTempFileName)
{
    CPalThread *pThread;
    INT path_size = 0;
    INT prefix_size = 0;
    CHAR * full_name;
    CHAR * prefix_string;
    CHAR * tempfile_name;
    PathCharString full_namePS, prefix_stringPS;
    INT length = 0;
    UINT   uRet;

    PERF_ENTRY(GetTempFileNameW);
    ENTRY("GetTempFileNameW(lpPathName=%p (%S), lpPrefixString=%p (%S), uUnique=%u, "
          "lpTempFileName=%p)\n", lpPathName?lpPathName:W16_NULLSTRING, lpPathName?lpPathName:W16_NULLSTRING,
          lpPrefixString?lpPrefixString:W16_NULLSTRING,
          lpPrefixString?lpPrefixString:W16_NULLSTRING,uUnique, lpTempFileName);

    pThread = InternalGetCurrentThread();
    /* Sanity checks. */
    if ( !lpPathName || *lpPathName == '\0' )
    {
        pThread->SetLastError( ERROR_DIRECTORY );
        uRet = 0;
        goto done;
    }

    length = (PAL_wcslen(lpPathName)+1) * MaxWCharToAcpLengthFactor;
    full_name = full_namePS.OpenStringBuffer(length);
    if (NULL == full_name)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        uRet = 0;
        goto done;
    }
    path_size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, full_name,
                                     length, NULL, NULL );
    full_namePS.CloseBuffer(path_size);
                                     
    if( path_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        uRet = 0;
        goto done;
    }
    
    if (lpPrefixString != NULL) 
    {
        length = (PAL_wcslen(lpPrefixString)+1) * MaxWCharToAcpLengthFactor;
        prefix_string = prefix_stringPS.OpenStringBuffer(length);
        if (NULL == prefix_string)
        {
            pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            uRet = 0;
            goto done;
        }
        prefix_size = WideCharToMultiByte( CP_ACP, 0, lpPrefixString, -1, 
                                           prefix_string,
                                           MAX_LONGPATH - path_size - MAX_SEEDSIZE, 
                                           NULL, NULL );
        prefix_stringPS.CloseBuffer(prefix_size);
        
        if( prefix_size == 0 )
        {
            DWORD dwLastError = GetLastError();
            if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
            {
                WARN("Full name would be larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
                pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
            }
            else
            {
                ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
                pThread->SetLastError(ERROR_INTERNAL_ERROR);
            }
            uRet = 0;
            goto done;
        }
    }
    
    tempfile_name = (char*)InternalMalloc(MAX_LONGPATH);
    if (tempfile_name == NULL)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        uRet = 0;
        goto done;
    }
    
    uRet = GetTempFileNameA(full_name, 
                            (lpPrefixString == NULL) ? NULL : prefix_string,
                            0, tempfile_name);
    if (uRet)
    {                    
        path_size = MultiByteToWideChar( CP_ACP, 0, tempfile_name, -1, 
                                           lpTempFileName, MAX_LONGPATH );

        InternalFree(tempfile_name);
        tempfile_name = NULL;
        if (!path_size)
        {
            DWORD dwLastError = GetLastError();
            if (dwLastError == ERROR_INSUFFICIENT_BUFFER)
            {
                WARN("File names larger than MAX_PATH_FNAME (%d)! \n", MAX_LONGPATH);
                dwLastError = ERROR_FILENAME_EXCED_RANGE;
            }
            else
            {
                ASSERT("MultiByteToWideChar failure! error is %d", dwLastError);     
                dwLastError = ERROR_INTERNAL_ERROR;
            }
            pThread->SetLastError(dwLastError);
            uRet = 0;
        }
    }

done:
    LOGEXIT("GetTempFileNameW returns UINT %u\n", uRet);
    PERF_EXIT(GetTempFileNameW);
    return uRet;
}